

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(reverse_lock *this)

{
  bool bVar1;
  long lVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> *pUVar3;
  mutex_type *pmVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar3 = this->lock;
  pmVar4 = (this->templock).super_unique_lock._M_device;
  (this->templock).super_unique_lock._M_device = (pUVar3->super_unique_lock)._M_device;
  (pUVar3->super_unique_lock)._M_device = pmVar4;
  bVar1 = (this->templock).super_unique_lock._M_owns;
  (this->templock).super_unique_lock._M_owns = (pUVar3->super_unique_lock)._M_owns;
  (pUVar3->super_unique_lock)._M_owns = bVar1;
  std::unique_lock<std::mutex>::lock(&this->lock->super_unique_lock);
  std::__cxx11::string::~string((string *)&this->file);
  std::__cxx11::string::~string((string *)&this->lockname);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::unique_lock<std::mutex>::~unique_lock(&(this->templock).super_unique_lock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~reverse_lock() {
            templock.swap(lock);
            EnterCritical(lockname.c_str(), file.c_str(), line, lock.mutex());
            lock.lock();
        }